

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDMMCSimulationDataGenerator.cpp
# Opt level: O0

void __thiscall
SDMMCSimulationDataGenerator::CreateResponse48
          (SDMMCSimulationDataGenerator *this,uint index,unsigned_long arg)

{
  SimulationChannelDescriptor *pSVar1;
  int iVar2;
  int local_4c;
  int i_1;
  U8 crc;
  int local_34;
  BitExtractor local_30 [4];
  int i;
  BitExtractor bits;
  U64 data;
  unsigned_long arg_local;
  uint index_local;
  SDMMCSimulationDataGenerator *this_local;
  
  _bits = (ulong)index << 0x20 | arg;
  iVar2 = SimulationChannelDescriptor::GetCurrentBitState();
  if (iVar2 != 1) {
    SimulationChannelDescriptor::Transition();
    ClockGenerator::AdvanceByHalfPeriod(0.5);
    SimulationChannelDescriptorGroup::AdvanceAll((int)this + 0x18);
  }
  CreateClockPeriod(this);
  CreateClockPeriod(this);
  BitExtractor::BitExtractor(local_30,_bits,MsbFirst,0x28);
  for (local_34 = 0; local_34 < 0x28; local_34 = local_34 + 1) {
    pSVar1 = this->mCommand;
    BitExtractor::GetNextBit();
    SimulationChannelDescriptor::TransitionIfNeeded((BitState)pSVar1);
    CreateClockPeriod(this);
  }
  SDMMCHelpers::crc7((U8 *)&bits,5);
  for (local_4c = 0; local_4c < 7; local_4c = local_4c + 1) {
    SimulationChannelDescriptor::TransitionIfNeeded((BitState)this->mCommand);
    CreateClockPeriod(this);
  }
  SimulationChannelDescriptor::TransitionIfNeeded((BitState)this->mCommand);
  CreateClockPeriod(this);
  BitExtractor::~BitExtractor(local_30);
  return;
}

Assistant:

void SDMMCSimulationDataGenerator::CreateResponse48(unsigned int index, unsigned long arg)
{
	U64 data =
		(0ull       << 39) | /* start bit */
		(0ull       << 38) | /* transmission bit: host */
		((U64)index << 32) | /* command index */
		((U64)arg   <<  0);  /* command argument */

	/* make sure we continue with clock as high */
	if (mClock->GetCurrentBitState() != BIT_HIGH) {
		mClock->Transition();
		mChannels.AdvanceAll(mClockGenerator.AdvanceByHalfPeriod(.5));
	}

	CreateClockPeriod();
	CreateClockPeriod();

	BitExtractor bits(data, AnalyzerEnums::MsbFirst, 40);

	for (int i = 0; i < 40; i++) {
		mCommand->TransitionIfNeeded(bits.GetNextBit());
		CreateClockPeriod();
	}

	/* FIXME: ugly, only works on little-endian */
	U8 crc = SDMMCHelpers::crc7((U8 *)&data, 5);

	for (int i = 0; i < 7; i++) {
		crc <<= 1;

		mCommand->TransitionIfNeeded(crc & 0x80 ? BIT_HIGH : BIT_LOW);
		CreateClockPeriod();
	}

	/* stop bit */
	mCommand->TransitionIfNeeded(BIT_HIGH);
	CreateClockPeriod();
}